

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::RegisterTests
          (ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  pointer pcVar3;
  element_type *peVar4;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<int>_>_>
  _Var5;
  _Alloc_hider _Var6;
  size_type sVar7;
  char *name;
  ulong uVar8;
  char cVar9;
  bool bVar10;
  int iVar11;
  long *plVar12;
  long *plVar13;
  ostream *poVar14;
  size_t sVar15;
  const_iterator cVar16;
  char *pcVar17;
  undefined4 extraout_var;
  TestFactoryBase *factory;
  undefined4 extraout_var_00;
  ulong uVar18;
  pointer pIVar19;
  size_type sVar20;
  string param_name;
  string test_suite_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  test_param_names;
  string test_name;
  ParamGenerator<int> generator;
  GTestLog local_1c0;
  int local_1bc;
  long *local_1b8;
  pointer local_1b0;
  char *local_1a8;
  string local_1a0;
  string local_180;
  long *local_160;
  undefined1 *local_158;
  long local_150;
  undefined1 local_148;
  undefined7 uStack_147;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest> *local_108;
  int *local_100;
  char *local_f8;
  undefined8 local_f0;
  char local_e8;
  undefined7 uStack_e7;
  string local_d8;
  long *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  CodeLocation local_a8;
  pointer local_80;
  pointer local_78;
  pointer local_70;
  ParamNameGeneratorFunc *local_68;
  char *local_60;
  CodeLocation local_58;
  
  local_158 = &local_148;
  local_150 = 0;
  local_148 = 0;
  local_f8 = &local_e8;
  local_f0 = 0;
  local_e8 = '\0';
  local_1b0 = (this->tests_).
              super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::TestInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_80 = (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1b0 != local_80) {
    bVar10 = false;
    local_108 = this;
    do {
      pIVar19 = (this->instantiations_).
                super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::InstantiationInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_78 = (this->instantiations_).
                 super__Vector_base<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::InstantiationInfo>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      if (pIVar19 != local_78) {
        do {
          (*pIVar19->generator)(&local_b8);
          local_68 = pIVar19->name_func;
          pcVar17 = pIVar19->file;
          local_1bc = pIVar19->line;
          if ((pIVar19->name)._M_string_length == 0) {
            local_150 = 0;
            *local_158 = 0;
          }
          else {
            local_138._M_impl._0_8_ = &local_138._M_impl.super__Rb_tree_header._M_header._M_parent;
            pcVar3 = (pIVar19->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_138,pcVar3,pcVar3 + (pIVar19->name)._M_string_length);
            std::__cxx11::string::append((char *)&local_138);
            std::__cxx11::string::operator=((string *)&local_158,(string *)&local_138);
            if ((_Base_ptr *)local_138._M_impl._0_8_ !=
                &local_138._M_impl.super__Rb_tree_header._M_header._M_parent) {
              operator_delete((void *)local_138._M_impl._0_8_,
                              (ulong)((long)&(local_138._M_impl.super__Rb_tree_header._M_header.
                                             _M_parent)->_M_color + 1));
            }
          }
          std::__cxx11::string::_M_append
                    ((char *)&local_158,(ulong)(this->test_suite_name_)._M_dataplus._M_p);
          local_138._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_138._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          local_138._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_138._M_impl.super__Rb_tree_header._M_header;
          local_138._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_1a8 = pcVar17;
          local_138._M_impl.super__Rb_tree_header._M_header._M_right =
               local_138._M_impl.super__Rb_tree_header._M_header._M_left;
          plVar12 = (long *)(**(code **)(*local_b8 + 0x10))();
          plVar13 = (long *)(**(code **)(*local_b8 + 0x18))();
          local_70 = pIVar19;
          if (plVar12 != plVar13) {
            sVar20 = 0;
            local_1b8 = plVar13;
            local_160 = plVar12;
            do {
              cVar9 = (**(code **)(*plVar12 + 0x30))(plVar12,local_1b8);
              plVar13 = local_1b8;
              if (cVar9 != '\0') break;
              local_100 = (int *)(**(code **)(*plVar12 + 0x28))(plVar12);
              local_f0 = 0;
              *local_f8 = '\0';
              local_1a0._M_dataplus._M_p._0_4_ = *local_100;
              local_1a0._M_string_length = sVar20;
              (*local_68)(&local_180,(TestParamInfo<int> *)&local_1a0);
              sVar7 = local_180._M_string_length;
              _Var6._M_p = local_180._M_dataplus._M_p;
              if (local_180._M_string_length == 0) {
                bVar10 = false;
              }
              else {
                bVar2 = *local_180._M_dataplus._M_p;
                iVar11 = isalnum((uint)bVar2);
                if ((bVar2 == 0x5f) || (iVar11 != 0)) {
                  uVar8 = 1;
                  do {
                    uVar18 = uVar8;
                    if (sVar7 == uVar18) break;
                    bVar2 = _Var6._M_p[uVar18];
                    iVar11 = isalnum((uint)bVar2);
                    uVar8 = uVar18 + 1;
                  } while ((bVar2 == 0x5f) || (iVar11 != 0));
                  bVar10 = sVar7 <= uVar18;
                }
                else {
                  bVar10 = false;
                }
              }
              bVar10 = IsTrue(bVar10);
              if (!bVar10) {
                GTestLog::GTestLog((GTestLog *)&local_1a0,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x247);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Condition IsValidParamName(param_name) failed. ",
                           0x2f);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Parameterized test name \'",0x19);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_180._M_dataplus._M_p,
                                     local_180._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,
                           "\' is invalid (contains spaces, dashes, or any non-alphanumeric characters other than underscores), in "
                           ,0x66);
                pcVar17 = local_1a8;
                if (local_1a8 == (char *)0x0) {
                  std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
                }
                else {
                  sVar15 = strlen(local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar17,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," line ",6);
                poVar14 = (ostream *)std::ostream::operator<<(poVar14,local_1bc);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"",0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
                std::ostream::put((char)poVar14);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_1a0);
              }
              cVar16 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_138,&local_180);
              bVar10 = IsTrue((_Rb_tree_header *)cVar16._M_node ==
                              &local_138._M_impl.super__Rb_tree_header);
              if (!bVar10) {
                GTestLog::GTestLog((GTestLog *)&local_1a0,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-param-util.h"
                                   ,0x24d);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition test_param_names.count(param_name) == 0 failed. ",0x3a);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"Duplicate parameterized test name \'",0x23);
                poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&std::cerr,local_180._M_dataplus._M_p,
                                     local_180._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\', in ",6);
                pcVar17 = local_1a8;
                if (local_1a8 == (char *)0x0) {
                  std::ios::clear((int)poVar14 + (int)*(undefined8 *)(*(long *)poVar14 + -0x18));
                }
                else {
                  sVar15 = strlen(local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,pcVar17,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," line ",6);
                plVar12 = (long *)std::ostream::operator<<(poVar14,local_1bc);
                std::ios::widen((char)*(undefined8 *)(*plVar12 + -0x18) + (char)plVar12);
                std::ostream::put((char)plVar12);
                std::ostream::flush();
                GTestLog::~GTestLog((GTestLog *)&local_1a0);
              }
              peVar4 = (local_1b0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              if ((peVar4->test_base_name)._M_string_length != 0) {
                pcVar17 = (char *)std::__cxx11::string::_M_append
                                            ((char *)&local_f8,
                                             (ulong)(peVar4->test_base_name)._M_dataplus._M_p);
                std::__cxx11::string::append(pcVar17);
              }
              std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_180._M_dataplus._M_p);
              std::
              _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::_M_insert_unique<std::__cxx11::string>
                        ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&local_138,&local_180);
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d8,local_158,local_158 + local_150);
              name = local_f8;
              PrintToString<int>(&local_1a0,local_100);
              pcVar17 = (char *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,
                                         (int)local_1a0._M_dataplus._M_p);
              peVar4 = (local_1b0->
                       super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
              local_a8.file._M_dataplus._M_p = (pointer)&local_a8.file.field_2;
              pcVar3 = (peVar4->code_location).file._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_a8,pcVar3,
                         pcVar3 + (peVar4->code_location).file._M_string_length);
              plVar12 = local_160;
              local_a8.line = (peVar4->code_location).line;
              local_60 = pcVar17;
              iVar11 = (*(local_108->super_ParameterizedTestSuiteInfoBase).
                         _vptr_ParameterizedTestSuiteInfoBase[3])();
              bVar10 = IsTrue(true);
              if (!bVar10) {
                GTestLog::GTestLog(&local_1c0,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x201);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition !test_case_fp || !test_suite_fp failed. ",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                           ,0x6a);
                pcVar17 = local_1a8;
                if (local_1a8 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x72b7a0);
                }
                else {
                  sVar15 = strlen(local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar17,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                std::ostream::operator<<(&std::cerr,local_1bc);
                GTestLog::~GTestLog(&local_1c0);
              }
              bVar10 = IsTrue(true);
              if (!bVar10) {
                GTestLog::GTestLog(&local_1c0,GTEST_FATAL,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                                   ,0x216);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Condition !test_case_fp || !test_suite_fp failed. ",0x32);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,
                           "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                           ,0x6f);
                pcVar17 = local_1a8;
                if (local_1a8 == (char *)0x0) {
                  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x72b7a0);
                }
                else {
                  sVar15 = strlen(local_1a8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,pcVar17,sVar15);
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
                std::ostream::operator<<(&std::cerr,local_1bc);
                GTestLog::~GTestLog(&local_1c0);
              }
              _Var5.super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>.
              _M_head_impl = (((local_1b0->
                               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr)->test_meta_factory)._M_t.
                             super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<int>,_std::default_delete<testing::internal::TestMetaFactoryBase<int>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<int>_>_>
                             .
                             super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>
              ;
              factory = (TestFactoryBase *)
                        (**(code **)(*(long *)_Var5.
                                              super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>
                                              ._M_head_impl + 0x10))
                                  (_Var5.
                                   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<int>_*,_false>
                                   ._M_head_impl,*local_100);
              MakeAndRegisterTestInfo
                        (&local_d8,name,(char *)0x0,local_60,&local_a8,
                         (TypeId)CONCAT44(extraout_var,iVar11),(SetUpTestSuiteFunc)0x0,
                         (TearDownTestSuiteFunc)0x0,factory);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_a8.file._M_dataplus._M_p != &local_a8.file.field_2) {
                operator_delete(local_a8.file._M_dataplus._M_p,
                                local_a8.file.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(local_1a0._M_dataplus._M_p._4_4_,(int)local_1a0._M_dataplus._M_p) !=
                  &local_1a0.field_2) {
                operator_delete((undefined1 *)
                                CONCAT44(local_1a0._M_dataplus._M_p._4_4_,
                                         (int)local_1a0._M_dataplus._M_p),
                                local_1a0.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_180._M_dataplus._M_p != &local_180.field_2) {
                operator_delete(local_180._M_dataplus._M_p,
                                local_180.field_2._M_allocated_capacity + 1);
              }
              (**(code **)(*plVar12 + 0x18))(plVar12);
              sVar20 = sVar20 + 1;
              bVar10 = true;
              plVar13 = local_1b8;
            } while (plVar12 != local_1b8);
          }
          this = local_108;
          if (plVar13 != (long *)0x0) {
            (**(code **)(*plVar13 + 8))(plVar13);
          }
          pIVar19 = local_70;
          if (plVar12 != (long *)0x0) {
            (**(code **)(*plVar12 + 8))(plVar12);
          }
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_138);
          if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
          }
          pIVar19 = pIVar19 + 1;
        } while (pIVar19 != local_78);
      }
      local_1b0 = local_1b0 + 1;
    } while (local_1b0 != local_80);
    if (bVar10) goto LAB_002f3dc4;
  }
  iVar11 = (*(this->super_ParameterizedTestSuiteInfoBase)._vptr_ParameterizedTestSuiteInfoBase[2])
                     (this);
  paVar1 = &local_58.file.field_2;
  pcVar3 = (this->code_location_).file._M_dataplus._M_p;
  local_58.file._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar3,pcVar3 + (this->code_location_).file._M_string_length);
  local_58.line = (this->code_location_).line;
  InsertSyntheticTestCase
            ((string *)CONCAT44(extraout_var_00,iVar11),&local_58,
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start !=
             (this->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::ECCurveTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.file._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.file._M_dataplus._M_p,local_58.file.field_2._M_allocated_capacity + 1);
  }
LAB_002f3dc4:
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(uStack_e7,local_e8) + 1);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158,CONCAT71(uStack_147,local_148) + 1);
  }
  return;
}

Assistant:

void RegisterTests() override {
    bool generated_instantiations = false;

    std::string test_suite_name;
    std::string test_name;
    for (const std::shared_ptr<TestInfo>& test_info : tests_) {
      for (const InstantiationInfo& instantiation : instantiations_) {
        const std::string& instantiation_name = instantiation.name;
        ParamGenerator<ParamType> generator((*instantiation.generator)());
        ParamNameGeneratorFunc* name_func = instantiation.name_func;
        const char* file = instantiation.file;
        int line = instantiation.line;

        if (!instantiation_name.empty())
          test_suite_name = instantiation_name + "/";
        else
          test_suite_name.clear();
        test_suite_name += test_suite_name_;

        size_t i = 0;
        std::set<std::string> test_param_names;
        for (const auto& param : generator) {
          generated_instantiations = true;

          test_name.clear();

          std::string param_name =
              name_func(TestParamInfo<ParamType>(param, i));

          GTEST_CHECK_(IsValidParamName(param_name))
              << "Parameterized test name '" << param_name
              << "' is invalid (contains spaces, dashes, or any "
                 "non-alphanumeric characters other than underscores), in "
              << file << " line " << line << "" << std::endl;

          GTEST_CHECK_(test_param_names.count(param_name) == 0)
              << "Duplicate parameterized test name '" << param_name << "', in "
              << file << " line " << line << std::endl;

          if (!test_info->test_base_name.empty()) {
            test_name.append(test_info->test_base_name).append("/");
          }
          test_name += param_name;

          test_param_names.insert(std::move(param_name));

          MakeAndRegisterTestInfo(
              test_suite_name, test_name.c_str(),
              nullptr,  // No type parameter.
              PrintToString(param).c_str(), test_info->code_location,
              GetTestSuiteTypeId(),
              SuiteApiResolver<TestSuite>::GetSetUpCaseOrSuite(file, line),
              SuiteApiResolver<TestSuite>::GetTearDownCaseOrSuite(file, line),
              test_info->test_meta_factory->CreateTestFactory(param));
          ++i;
        }  // for param
      }  // for instantiation
    }  // for test_info

    if (!generated_instantiations) {
      // There are no generaotrs, or they all generate nothing ...
      InsertSyntheticTestCase(GetTestSuiteName(), code_location_,
                              !tests_.empty());
    }
  }